

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O3

bool __thiscall Container::is_oom_killed(Container *this)

{
  pointer pcVar1;
  CgroupController *pCVar2;
  int iVar3;
  istream *piVar4;
  ContextManager *pCVar5;
  size_t in_RCX;
  string val;
  string name;
  string data;
  stringstream sstream;
  undefined1 *local_238;
  undefined8 local_230;
  undefined1 local_228;
  undefined7 uStack_227;
  undefined1 local_218 [32];
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> local_1f8 [2];
  long local_1e8 [2];
  undefined1 local_1d8 [32];
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> local_1b8 [2];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  pCVar2 = this->memory_controller_;
  local_1b8[0]._M_head_impl = (_Impl *)local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"memory.oom_control","");
  CgroupController::read((CgroupController *)local_1d8,(int)pCVar2,local_1b8,in_RCX);
  if (local_1b8[0]._M_head_impl != (_Impl *)local_1a8) {
    operator_delete(local_1b8[0]._M_head_impl,local_1a8[0] + 1);
  }
  pCVar2 = this->memory_controller_;
  local_238 = &local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"memory.oom_control","");
  CgroupController::read((CgroupController *)local_218,(int)pCVar2,&local_238,in_RCX);
  std::__cxx11::stringstream::stringstream
            ((stringstream *)local_1b8,(string *)local_218,_S_out|_S_in);
  pcVar1 = local_218 + 0x10;
  if ((pointer)local_218._0_8_ != pcVar1) {
    operator_delete((void *)local_218._0_8_,CONCAT71(local_218._17_7_,local_218[0x10]) + 1);
  }
  if (local_238 != &local_228) {
    operator_delete(local_238,CONCAT71(uStack_227,local_228) + 1);
  }
  local_218._8_8_ = 0;
  local_218[0x10] = '\0';
  local_230 = 0;
  local_228 = 0;
  local_238 = &local_228;
  local_218._0_8_ = pcVar1;
  do {
    piVar4 = std::operator>>((istream *)local_1b8,(string *)local_218);
    piVar4 = std::operator>>(piVar4,(string *)&local_238);
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
      pCVar5 = ContextManager::get();
      local_1f8[0]._M_head_impl = (_Impl *)local_1e8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1f8,"Can\'t find oom_kill field in memory.oom_control","");
      (**pCVar5->_vptr_ContextManager)(pCVar5,local_1f8);
      if (local_1f8[0]._M_head_impl != (_Impl *)local_1e8) {
        operator_delete(local_1f8[0]._M_head_impl,local_1e8[0] + 1);
      }
      _exit(-1);
    }
    iVar3 = std::__cxx11::string::compare((char *)local_218);
  } while (iVar3 != 0);
  iVar3 = std::__cxx11::string::compare((char *)&local_238);
  if (local_238 != &local_228) {
    operator_delete(local_238,CONCAT71(uStack_227,local_228) + 1);
  }
  if ((pointer)local_218._0_8_ != pcVar1) {
    operator_delete((void *)local_218._0_8_,CONCAT71(local_218._17_7_,local_218[0x10]) + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  if ((undefined1 *)local_1d8._0_8_ != local_1d8 + 0x10) {
    operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
  }
  return iVar3 != 0;
}

Assistant:

bool Container::is_oom_killed() {
    std::string data = memory_controller_->read("memory.oom_control");
    std::stringstream sstream(memory_controller_->read("memory.oom_control"));
    std::string name, val;
    while (sstream >> name >> val) {
        if (name == "oom_kill") {
            return (val != "0");
        }
    }
    die("Can't find oom_kill field in memory.oom_control");
    _exit(-1); // we should not get here
}